

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Flow.c
# Opt level: O3

int Llb_ManCutLiNum(Aig_Man_t *p,Vec_Ptr_t *vMinCut)

{
  ulong uVar1;
  Vec_Ptr_t *pVVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  uint uVar9;
  
  if ((long)vMinCut->nSize < 1) {
    iVar3 = 0;
  }
  else {
    uVar6 = 0xffffffff;
    lVar5 = 0;
    iVar3 = 0;
    do {
      uVar1 = *(ulong *)((long)vMinCut->pArray[lVar5] + 0x18);
      uVar4 = (uint)uVar1;
      if ((uVar4 & 7) != 2) {
        if (p->pFanData == (int *)0x0) {
          __assert_fail("p->pFanData",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/llb/llb2Flow.c"
                        ,0x11a,"int Llb_ManCutLiNum(Aig_Man_t *, Vec_Ptr_t *)");
        }
        if (0x3f < uVar4) {
          uVar4 = 0;
          do {
            if (uVar4 == 0) {
              iVar7 = *(int *)((long)vMinCut->pArray[lVar5] + 0x24);
              if (p->nFansAlloc <= iVar7) {
                __assert_fail("ObjId < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x1a8,"int Aig_ObjFanout0Int(Aig_Man_t *, int)");
              }
              iVar7 = iVar7 * 5;
            }
            else {
              if (p->nFansAlloc <= (int)uVar6 / 2) {
                __assert_fail("iFan/2 < p->nFansAlloc",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aig.h"
                              ,0x1a9,"int Aig_ObjFanoutNext(Aig_Man_t *, int)");
              }
              iVar7 = (uVar6 & 1) + ((int)uVar6 >> 1) * 5 + 3;
            }
            uVar6 = p->pFanData[iVar7];
            pVVar2 = p->vObjs;
            if (pVVar2 == (Vec_Ptr_t *)0x0) {
              piVar8 = (int *)0x0;
            }
            else {
              uVar9 = (int)uVar6 >> 1;
              if (((int)uVar9 < 0) || (pVVar2->nSize <= (int)uVar9)) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              piVar8 = (int *)pVVar2->pArray[uVar9];
            }
            if (((piVar8[6] & 7U) == 3) && (p->nTruePos <= *piVar8)) {
              iVar3 = iVar3 + 1;
              break;
            }
            uVar4 = uVar4 + 1;
          } while (((uint)(uVar1 >> 6) & 0x3ffffff) != uVar4);
        }
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != vMinCut->nSize);
  }
  return iVar3;
}

Assistant:

int Llb_ManCutLiNum( Aig_Man_t * p, Vec_Ptr_t * vMinCut )
{
    Aig_Obj_t * pFanout;
    Aig_Obj_t * pObj;
    int i, k, iFanout = -1, Counter = 0;
    Vec_PtrForEachEntry( Aig_Obj_t *, vMinCut, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
            continue;
        Aig_ObjForEachFanout( p, pObj, pFanout, iFanout, k )
        {
            if ( Saig_ObjIsLi(p, pFanout) )
            {
                Counter++;
                break;
            }
        }
    }
    return Counter;
}